

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExponentialEvaluationTest.cpp
# Opt level: O0

int main(int param_1,char **param_2)

{
  byte bVar1;
  double dVar2;
  __type _Var3;
  Variable x;
  string *in_stack_fffffffffffffed8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  undefined1 condition;
  undefined7 in_stack_fffffffffffffee8;
  Variable *arg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff18;
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [72];
  Variable local_28;
  int local_4;
  
  local_4 = 0;
  arg = &local_28;
  Kandinsky::Variable::Variable((Variable *)0x1184c3);
  Kandinsky::Variable::setValue
            ((Variable *)in_stack_fffffffffffffee0,(double)in_stack_fffffffffffffed8);
  Kandinsky::exp<Kandinsky::Variable,_nullptr>(arg);
  dVar2 = Kandinsky::ExponentialExpression::evaluate((ExponentialExpression *)0x1184fb);
  _Var3 = std::exp<int>(0);
  bVar1 = -(dVar2 == _Var3) & 1;
  Kandinsky::Variable::evaluate((Variable *)0x11853f);
  std::__cxx11::to_string((double)CONCAT17(bVar1,in_stack_fffffffffffffee8));
  std::operator+((char *)CONCAT17(bVar1,in_stack_fffffffffffffee8),in_stack_fffffffffffffee0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(bVar1,in_stack_fffffffffffffee8),(char *)in_stack_fffffffffffffee0);
  _Var3 = std::exp<int>(0);
  condition = (undefined1)((ulong)_Var3 >> 0x38);
  std::__cxx11::to_string((double)CONCAT17(bVar1,in_stack_fffffffffffffee8));
  std::operator+(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  Kandinsky::assertOrExit((bool)condition,in_stack_fffffffffffffed8);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff10);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::string::~string(local_d0);
  Kandinsky::ExponentialExpression::~ExponentialExpression((ExponentialExpression *)0x11862a);
  local_4 = 0;
  Kandinsky::Variable::~Variable((Variable *)0x118642);
  return local_4;
}

Assistant:

int main (int /*argc*/, char** /*argv*/)
{
    Variable x;
    x.setValue(3);
    assertOrExit(exp(x).evaluate() == std::exp(3), "e ^ " + std::to_string(x.evaluate()) + " != " + std::to_string(std::exp(3)));
    return 0;
}